

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O3

void __thiscall
EventDataType::serialize<cereal::PortableBinaryInputArchive>
          (EventDataType *this,PortableBinaryInputArchive *archive)

{
  PortableBinaryInputArchive *pPVar1;
  size_t in_RAX;
  size_type size;
  size_t local_38;
  
  pPVar1 = (((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
           super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self;
  local_38 = in_RAX;
  cereal::PortableBinaryInputArchive::loadBinary<8ul>
            ((((((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&local_38,8);
  std::__cxx11::string::resize((ulong)&this->name,(char)local_38);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            ((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             (this->name)._M_dataplus._M_p,local_38);
  pPVar1 = (((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
           super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self;
  cereal::PortableBinaryInputArchive::loadBinary<8ul>
            ((((((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&local_38,8);
  std::__cxx11::string::resize((ulong)&this->origin,(char)local_38);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            ((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             (this->origin)._M_dataplus._M_p,local_38);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(name, origin);
    }